

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastSquare(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int Level;
  int iVar1;
  int Entry;
  Vec_Wec_t *vProds;
  Vec_Wec_t *vLevels;
  ulong uVar2;
  int Level_00;
  ulong uVar3;
  ulong uVar4;
  
  vProds = Vec_WecStart(nNum * 2);
  vLevels = Vec_WecStart(nNum * 2);
  uVar2 = 0;
  if (0 < nNum) {
    uVar2 = (ulong)(uint)nNum;
  }
  iVar1 = 1;
  uVar4 = 0;
  do {
    if (uVar4 == uVar2) {
      Wlc_BlastReduceMatrix(pNew,vProds,vLevels,vRes,0,0);
      Vec_WecFree(vProds);
      Vec_WecFree(vLevels);
      return;
    }
    Level = (int)uVar4 * 2;
    for (uVar3 = 0; (uint)nNum != uVar3; uVar3 = uVar3 + 1) {
      if (uVar4 == uVar3) {
        Vec_WecPush(vProds,Level,pNum[uVar4]);
        Level_00 = Level;
LAB_006eafde:
        Vec_WecPush(vLevels,Level_00,0);
      }
      else if (uVar4 < uVar3) {
        Entry = Gia_ManHashAnd(pNew,pNum[uVar4],pNum[uVar3]);
        Level_00 = iVar1 + (int)uVar3;
        Vec_WecPush(vProds,Level_00,Entry);
        goto LAB_006eafde;
      }
    }
    iVar1 = iVar1 + 1;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void Wlc_BlastSquare( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    Vec_Wec_t * vProds  = Vec_WecStart( 2*nNum );
    Vec_Wec_t * vLevels = Vec_WecStart( 2*nNum );
    int i, k;
    for ( i = 0; i < nNum; i++ )
        for ( k = 0; k < nNum; k++ )
        {
            if ( i == k )
            {
                Vec_WecPush( vProds,  i+k, pNum[i] );
                Vec_WecPush( vLevels, i+k, 0 );
            }
            else if ( i < k )
            {
                Vec_WecPush( vProds,  i+k+1, Gia_ManHashAnd(pNew, pNum[i], pNum[k]) );
                Vec_WecPush( vLevels, i+k+1, 0 );
            }
        }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes, 0, 0 );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}